

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_open16(void *zFilename,sqlite3 **ppDb)

{
  Schema *pSVar1;
  uint uVar2;
  Mem *pMem;
  char *pcVar3;
  
  *ppDb = (sqlite3 *)0x0;
  uVar2 = sqlite3_initialize();
  if (uVar2 == 0) {
    pMem = (Mem *)sqlite3Malloc(0x38);
    if (pMem != (Mem *)0x0) {
      pcVar3 = "";
      if (zFilename != (void *)0x0) {
        pcVar3 = (char *)zFilename;
      }
      pMem->n = 0;
      pMem->flags = 0;
      pMem->enc = '\0';
      pMem->eSubtype = '\0';
      pMem->db = (sqlite3 *)0x0;
      pMem->szMalloc = 0;
      pMem->uTemp = 0;
      pMem->zMalloc = (char *)0x0;
      (pMem->u).r = 0.0;
      pMem->z = (char *)0x0;
      pMem->xDel = (_func_void_void_ptr *)0x0;
      pMem->flags = 1;
      sqlite3VdbeMemSetStr(pMem,pcVar3,-1,'\x02',(_func_void_void_ptr *)0x0);
    }
    pcVar3 = (char *)sqlite3ValueText(pMem,'\x01');
    if (pcVar3 == (char *)0x0) {
      uVar2 = 7;
    }
    else {
      uVar2 = openDatabase(pcVar3,ppDb,6,(char *)0x0);
      if (uVar2 == 0) {
        pSVar1 = (*ppDb)->aDb->pSchema;
        if ((pSVar1->schemaFlags & 1) == 0) {
          (*ppDb)->enc = '\x02';
          pSVar1->enc = '\x02';
        }
        uVar2 = 0;
      }
    }
    sqlite3ValueFree(pMem);
    uVar2 = uVar2 & 0xff;
  }
  return uVar2;
}

Assistant:

SQLITE_API int sqlite3_open16(
  const void *zFilename,
  sqlite3 **ppDb
){
  char const *zFilename8;   /* zFilename encoded in UTF-8 instead of UTF-16 */
  sqlite3_value *pVal;
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppDb==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppDb = 0;
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  if( zFilename==0 ) zFilename = "\000\000";
  pVal = sqlite3ValueNew(0);
  sqlite3ValueSetStr(pVal, -1, zFilename, SQLITE_UTF16NATIVE, SQLITE_STATIC);
  zFilename8 = sqlite3ValueText(pVal, SQLITE_UTF8);
  if( zFilename8 ){
    rc = openDatabase(zFilename8, ppDb,
                      SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE, 0);
    assert( *ppDb || rc==SQLITE_NOMEM );
    if( rc==SQLITE_OK && !DbHasProperty(*ppDb, 0, DB_SchemaLoaded) ){
      SCHEMA_ENC(*ppDb) = ENC(*ppDb) = SQLITE_UTF16NATIVE;
    }
  }else{
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3ValueFree(pVal);

  return rc & 0xff;
}